

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::AperB(double **_A,double **_B,double **_res,int _righA,int _colA,int _righB,
                     int _colB)

{
  int local_38;
  int local_34;
  int l;
  int q;
  int p;
  int _righB_local;
  int _colA_local;
  int _righA_local;
  double **_res_local;
  double **_B_local;
  double **_A_local;
  
  for (l = 1; l <= _righA; l = l + 1) {
    for (local_34 = 1; local_34 <= _colB; local_34 = local_34 + 1) {
      _res[l][local_34] = 0.0;
      for (local_38 = 1; local_38 <= _colA; local_38 = local_38 + 1) {
        _res[l][local_34] = _A[l][local_38] * _B[local_38][local_34] + _res[l][local_34];
      }
    }
  }
  return;
}

Assistant:

void EDCircles::AperB(double ** _A, double ** _B, double ** _res, int _righA, int _colA, int _righB, int _colB)
{
	int p, q, l;
	for (p = 1; p <= _righA; p++)
		for (q = 1; q <= _colB; q++)
		{
			_res[p][q] = 0.0;
			for (l = 1; l <= _colA; l++)
				_res[p][q] = _res[p][q] + _A[p][l] * _B[l][q];
		}
}